

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopThreadPool.cpp
# Opt level: O0

void __thiscall EventLoopThreadPool::start(EventLoopThreadPool *this)

{
  EventLoopThread *this_00;
  element_type *this_01;
  EventLoop *local_40 [3];
  undefined1 local_28 [8];
  shared_ptr<EventLoopThread> t;
  int i;
  EventLoopThreadPool *this_local;
  
  EventLoop::assertInLoopThread(this->baseLoop_);
  this->started_ = true;
  for (t.super___shared_ptr<EventLoopThread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 0
      ; t.super___shared_ptr<EventLoopThread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ <
        this->numThreads_;
      t.super___shared_ptr<EventLoopThread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
           t.super___shared_ptr<EventLoopThread,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
           + 1) {
    this_00 = (EventLoopThread *)operator_new(0x138);
    EventLoopThread::EventLoopThread(this_00);
    std::shared_ptr<EventLoopThread>::shared_ptr<EventLoopThread,void>
              ((shared_ptr<EventLoopThread> *)local_28,this_00);
    this_01 = std::__shared_ptr_access<EventLoopThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<EventLoopThread,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_28);
    local_40[0] = EventLoopThread::startLoop(this_01);
    std::vector<EventLoop_*,_std::allocator<EventLoop_*>_>::push_back(&this->loops_,local_40);
    std::
    vector<std::shared_ptr<EventLoopThread>,_std::allocator<std::shared_ptr<EventLoopThread>_>_>::
    push_back(&this->threads_,(value_type *)local_28);
    std::shared_ptr<EventLoopThread>::~shared_ptr((shared_ptr<EventLoopThread> *)local_28);
  }
  return;
}

Assistant:

void EventLoopThreadPool::start() {
    baseLoop_->assertInLoopThread();
    started_ = true;
    for (int i = 0; i < numThreads_; ++i) {
        std::shared_ptr<EventLoopThread> t(new EventLoopThread());
        loops_.push_back(t->startLoop());
        threads_.push_back(std::move(t));
    }
}